

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::nonbasicValue(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *__return_storage_ptr__,
               SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  uint *puVar1;
  uint uVar2;
  Status SVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int32_t iVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  pointer pnVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  pointer pnVar13;
  ulong uVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_b8;
  long local_80;
  cpp_dec_float<50U,_int,_void> local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  local_78.fpclass = cpp_dec_float_finite;
  local_78.prec_elem = 10;
  local_78.data._M_elems[0] = 0;
  local_78.data._M_elems[1] = 0;
  local_78.data._M_elems[2] = 0;
  local_78.data._M_elems[3] = 0;
  local_78.data._M_elems[4] = 0;
  local_78.data._M_elems[5] = 0;
  local_78.data._M_elems._24_5_ = 0;
  local_78.data._M_elems[7]._1_3_ = 0;
  local_78.data._M_elems._32_5_ = 0;
  local_78.data._M_elems[9]._1_3_ = 0;
  local_78.exp = 0;
  local_78.neg = false;
  if (this->m_nonbasicValueUpToDate == true) {
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8);
    uVar4 = *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems;
    uVar5 = *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2);
    uVar6 = *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
         *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar6;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar4;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar5;
    (__return_storage_ptr__->m_backend).exp = (this->m_nonbasicValue).m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = (this->m_nonbasicValue).m_backend.neg;
    iVar7 = (this->m_nonbasicValue).m_backend.prec_elem;
    (__return_storage_ptr__->m_backend).fpclass = (this->m_nonbasicValue).m_backend.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = iVar7;
  }
  else {
    local_38 = __return_storage_ptr__;
    if (this->theRep == COLUMN) {
      uVar2 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      uVar11 = (ulong)uVar2;
      if (this->theType == LEAVE) {
        if (0 < (int)uVar2) {
          uVar14 = uVar11 + 1;
          lVar10 = uVar11 * 0x38;
          do {
            uVar11 = uVar11 - 1;
            SVar3 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.colstat.data[uVar14 - 2];
            if (SVar3 == P_FIXED) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_0028ae2a:
              pnVar13 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_0028ae31:
              pcVar8 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar13[-1].m_backend.data + lVar10)
              ;
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.exp = 0;
              local_b8.neg = false;
              if (pcVar8 == &local_b8) {
                pcVar8 = &pnVar9[uVar11].m_backend;
              }
              else {
                puVar1 = (uint *)((long)&pnVar9[-1].m_backend.data + lVar10);
                if ((cpp_dec_float<50U,_int,_void> *)puVar1 != &local_b8) {
                  local_b8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(puVar1 + 8),0);
                  local_b8.data._M_elems[9]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 8) >> 0x28);
                  local_b8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                  local_b8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                  local_b8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                  local_b8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar1 + 6),0);
                  local_b8.data._M_elems[7]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 6) >> 0x28);
                  local_b8.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar10 + 0x28);
                  local_b8.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar10 + 0x2c);
                  local_b8._48_8_ =
                       *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar10 + 0x30);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_b8,pcVar8);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_78,&local_b8);
            }
            else {
              if (SVar3 == P_ON_LOWER) {
                pnVar9 = (this->theLCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_0028ae2a;
              }
              if (SVar3 == P_ON_UPPER) {
                pnVar9 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pnVar13 = (this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_0028ae31;
              }
            }
            uVar14 = uVar14 - 1;
            lVar10 = lVar10 + -0x38;
          } while (1 < uVar14);
        }
        lVar10 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar10) {
          uVar11 = lVar10 + 1;
          lVar12 = lVar10 * 0x38;
          do {
            lVar10 = lVar10 + -1;
            SVar3 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data[uVar11 - 2];
            if (SVar3 == P_FIXED) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_0028af28:
              pnVar13 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_0028af2c:
              pcVar8 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar13[-1].m_backend.data + lVar12)
              ;
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.exp = 0;
              local_b8.neg = false;
              if (pcVar8 == &local_b8) {
                pcVar8 = &pnVar9[lVar10].m_backend;
              }
              else {
                puVar1 = (uint *)((long)&pnVar9[-1].m_backend.data + lVar12);
                if ((cpp_dec_float<50U,_int,_void> *)puVar1 != &local_b8) {
                  local_b8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(puVar1 + 8),0);
                  local_b8.data._M_elems[9]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 8) >> 0x28);
                  local_b8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                  local_b8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                  local_b8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                  local_b8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar1 + 6),0);
                  local_b8.data._M_elems[7]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 6) >> 0x28);
                  local_b8.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x28);
                  local_b8.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x2c);
                  local_b8._48_8_ =
                       *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x30);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_b8,pcVar8);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_78,&local_b8);
            }
            else {
              if (SVar3 == P_ON_LOWER) {
                pnVar9 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_0028af28;
              }
              if (SVar3 == P_ON_UPPER) {
                pnVar9 = (this->theLRbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pnVar13 = (this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .right.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_0028af2c;
              }
            }
            uVar11 = uVar11 - 1;
            lVar12 = lVar12 + -0x38;
          } while (1 < uVar11);
        }
      }
      else {
        if (0 < (int)uVar2) {
          uVar14 = uVar11 + 1;
          lVar10 = uVar11 * 0x38;
          do {
            uVar11 = uVar11 - 1;
            SVar3 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.colstat.data[uVar14 - 2];
            if ((SVar3 == P_FIXED) || (SVar3 == P_ON_LOWER)) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar13 = (this->theLCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_0028b3c6:
              pcVar8 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar13[-1].m_backend.data + lVar10)
              ;
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.exp = 0;
              local_b8.neg = false;
              if (pcVar8 == &local_b8) {
                pcVar8 = &pnVar9[uVar11].m_backend;
              }
              else {
                puVar1 = (uint *)((long)&pnVar9[-1].m_backend.data + lVar10);
                if ((cpp_dec_float<50U,_int,_void> *)puVar1 != &local_b8) {
                  local_b8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(puVar1 + 8),0);
                  local_b8.data._M_elems[9]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 8) >> 0x28);
                  local_b8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                  local_b8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                  local_b8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                  local_b8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar1 + 6),0);
                  local_b8.data._M_elems[7]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 6) >> 0x28);
                  local_b8.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar10 + 0x28);
                  local_b8.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar10 + 0x2c);
                  local_b8._48_8_ =
                       *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar10 + 0x30);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_b8,pcVar8);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_78,&local_b8);
            }
            else if (SVar3 == P_ON_UPPER) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar13 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_0028b3c6;
            }
            uVar14 = uVar14 - 1;
            lVar10 = lVar10 + -0x38;
          } while (1 < uVar14);
        }
        lVar10 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar10) {
          uVar11 = lVar10 + 1;
          lVar12 = lVar10 * 0x38;
          do {
            lVar10 = lVar10 + -1;
            SVar3 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data[uVar11 - 2];
            if ((SVar3 == P_FIXED) || (SVar3 == P_ON_LOWER)) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar13 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_0028b4bd:
              pcVar8 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar13[-1].m_backend.data + lVar12)
              ;
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.exp = 0;
              local_b8.neg = false;
              if (pcVar8 == &local_b8) {
                pcVar8 = &pnVar9[lVar10].m_backend;
              }
              else {
                puVar1 = (uint *)((long)&pnVar9[-1].m_backend.data + lVar12);
                if ((cpp_dec_float<50U,_int,_void> *)puVar1 != &local_b8) {
                  local_b8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(puVar1 + 8),0);
                  local_b8.data._M_elems[9]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 8) >> 0x28);
                  local_b8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                  local_b8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                  local_b8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                  local_b8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar1 + 6),0);
                  local_b8.data._M_elems[7]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar1 + 6) >> 0x28);
                  local_b8.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x28);
                  local_b8.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x2c);
                  local_b8._48_8_ =
                       *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x30);
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_b8,pcVar8);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_78,&local_b8);
            }
            else if (SVar3 == P_ON_UPPER) {
              pnVar9 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar13 = (this->theLRbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_0028b4bd;
            }
            uVar11 = uVar11 - 1;
            lVar12 = lVar12 + -0x38;
          } while (1 < uVar11);
        }
      }
    }
    else {
      lVar10 = (long)(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
      if (0 < lVar10) {
        uVar11 = lVar10 + 1;
        lVar12 = lVar10 * 0x38;
        do {
          lVar10 = lVar10 + -1;
          SVar3 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[uVar11 - 2];
          if (SVar3 == D_ON_BOTH) {
            pnVar9 = (this->theLCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_80 = lVar10 * 0x38;
            pcVar8 = (cpp_dec_float<50U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar12);
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            if (pcVar8 == &local_b8) {
              pcVar8 = &pnVar9[lVar10].m_backend;
            }
            else {
              puVar1 = (uint *)((long)&pnVar9[-1].m_backend.data + lVar12);
              if ((cpp_dec_float<50U,_int,_void> *)puVar1 != &local_b8) {
                local_b8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(puVar1 + 8),0);
                local_b8.data._M_elems[9]._1_3_ =
                     (undefined3)((ulong)*(undefined8 *)(puVar1 + 8) >> 0x28);
                local_b8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                local_b8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                local_b8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                local_b8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar1 + 6),0);
                local_b8.data._M_elems[7]._1_3_ =
                     (undefined3)((ulong)*(undefined8 *)(puVar1 + 6) >> 0x28);
                local_b8.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x28);
                local_b8.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x2c);
                local_b8._48_8_ = *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x30);
              }
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_b8,pcVar8);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_78,&local_b8);
            pnVar9 = (this->theUCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar8 = (cpp_dec_float<50U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .low.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar12);
            if (pcVar8 == &local_b8) {
              pcVar8 = (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar9->m_backend).data + local_80)
              ;
              goto LAB_0028b173;
            }
LAB_0028b12e:
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.neg = false;
            local_b8.exp = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            puVar1 = (uint *)((long)&pnVar9[-1].m_backend.data + lVar12);
            if ((cpp_dec_float<50U,_int,_void> *)puVar1 != &local_b8) {
              local_b8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(puVar1 + 8),0);
              local_b8.data._M_elems[9]._1_3_ =
                   (undefined3)((ulong)*(undefined8 *)(puVar1 + 8) >> 0x28);
              local_b8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
              local_b8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
              local_b8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
              local_b8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar1 + 6),0);
              local_b8.data._M_elems[7]._1_3_ =
                   (undefined3)((ulong)*(undefined8 *)(puVar1 + 6) >> 0x28);
              local_b8.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x28);
              local_b8.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x2c);
              local_b8._48_8_ = *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x30);
            }
LAB_0028b176:
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_b8,pcVar8);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_78,&local_b8);
          }
          else {
            if (SVar3 == D_ON_LOWER) {
              pnVar9 = (this->theLCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar13 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_0028b028:
              pcVar8 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar13[-1].m_backend.data + lVar12)
              ;
              if (pcVar8 != &local_b8) goto LAB_0028b12e;
              pcVar8 = &pnVar9[lVar10].m_backend;
LAB_0028b173:
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.neg = false;
              local_b8.exp = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              goto LAB_0028b176;
            }
            if (SVar3 == D_ON_UPPER) {
              pnVar9 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar13 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_0028b028;
            }
          }
          uVar11 = uVar11 - 1;
          lVar12 = lVar12 + -0x38;
        } while (1 < uVar11);
      }
      lVar10 = (long)(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
      if (0 < lVar10) {
        uVar11 = lVar10 + 1;
        lVar12 = lVar10 * 0x38;
        do {
          lVar10 = lVar10 + -1;
          SVar3 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[uVar11 - 2];
          if (SVar3 == D_ON_BOTH) {
            pnVar9 = (this->theLRbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_80 = lVar10 * 0x38;
            pcVar8 = (cpp_dec_float<50U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .right.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar12);
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            if (pcVar8 == &local_b8) {
              pcVar8 = &pnVar9[lVar10].m_backend;
            }
            else {
              puVar1 = (uint *)((long)&pnVar9[-1].m_backend.data + lVar12);
              if ((cpp_dec_float<50U,_int,_void> *)puVar1 != &local_b8) {
                local_b8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(puVar1 + 8),0);
                local_b8.data._M_elems[9]._1_3_ =
                     (undefined3)((ulong)*(undefined8 *)(puVar1 + 8) >> 0x28);
                local_b8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                local_b8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                local_b8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
                local_b8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar1 + 6),0);
                local_b8.data._M_elems[7]._1_3_ =
                     (undefined3)((ulong)*(undefined8 *)(puVar1 + 6) >> 0x28);
                local_b8.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x28);
                local_b8.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x2c);
                local_b8._48_8_ = *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x30);
              }
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_b8,pcVar8);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_78,&local_b8);
            pnVar9 = (this->theURbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar8 = (cpp_dec_float<50U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .left.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar12);
            if (pcVar8 == &local_b8) {
              pcVar8 = (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar9->m_backend).data + local_80)
              ;
              goto LAB_0028b33f;
            }
LAB_0028b2fa:
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.neg = false;
            local_b8.exp = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            puVar1 = (uint *)((long)&pnVar9[-1].m_backend.data + lVar12);
            if ((cpp_dec_float<50U,_int,_void> *)puVar1 != &local_b8) {
              local_b8.data._M_elems._32_5_ = SUB85(*(undefined8 *)(puVar1 + 8),0);
              local_b8.data._M_elems[9]._1_3_ =
                   (undefined3)((ulong)*(undefined8 *)(puVar1 + 8) >> 0x28);
              local_b8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
              local_b8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
              local_b8.data._M_elems._16_8_ = *(undefined8 *)(puVar1 + 4);
              local_b8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar1 + 6),0);
              local_b8.data._M_elems[7]._1_3_ =
                   (undefined3)((ulong)*(undefined8 *)(puVar1 + 6) >> 0x28);
              local_b8.exp = *(int *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x28);
              local_b8.neg = *(bool *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x2c);
              local_b8._48_8_ = *(undefined8 *)((long)&pnVar9[-1].m_backend.data + lVar12 + 0x30);
            }
LAB_0028b342:
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_b8,pcVar8);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_78,&local_b8);
          }
          else {
            if (SVar3 == D_ON_LOWER) {
              pnVar9 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar13 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_0028b1f7:
              pcVar8 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar13[-1].m_backend.data + lVar12)
              ;
              if (pcVar8 != &local_b8) goto LAB_0028b2fa;
              pcVar8 = &pnVar9[lVar10].m_backend;
LAB_0028b33f:
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.neg = false;
              local_b8.exp = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              goto LAB_0028b342;
            }
            if (SVar3 == D_ON_UPPER) {
              pnVar9 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar13 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_0028b1f7;
            }
          }
          uVar11 = uVar11 - 1;
          lVar12 = lVar12 + -0x38;
        } while (1 < uVar11);
      }
    }
    if (this->m_nonbasicValueUpToDate == false) {
      *(ulong *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) =
           CONCAT35(local_78.data._M_elems[9]._1_3_,local_78.data._M_elems._32_5_);
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4) =
           local_78.data._M_elems._16_8_;
      *(ulong *)((this->m_nonbasicValue).m_backend.data._M_elems + 6) =
           CONCAT35(local_78.data._M_elems[7]._1_3_,local_78.data._M_elems._24_5_);
      *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems = local_78.data._M_elems._0_8_;
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2) =
           local_78.data._M_elems._8_8_;
      (this->m_nonbasicValue).m_backend.exp = local_78.exp;
      (this->m_nonbasicValue).m_backend.neg = local_78.neg;
      (this->m_nonbasicValue).m_backend.fpclass = local_78.fpclass;
      (this->m_nonbasicValue).m_backend.prec_elem = local_78.prec_elem;
      this->m_nonbasicValueUpToDate = true;
    }
    *(ulong *)((local_38->m_backend).data._M_elems + 8) =
         CONCAT35(local_78.data._M_elems[9]._1_3_,local_78.data._M_elems._32_5_);
    *(undefined8 *)((local_38->m_backend).data._M_elems + 4) = local_78.data._M_elems._16_8_;
    *(ulong *)((local_38->m_backend).data._M_elems + 6) =
         CONCAT35(local_78.data._M_elems[7]._1_3_,local_78.data._M_elems._24_5_);
    *(undefined8 *)(local_38->m_backend).data._M_elems = local_78.data._M_elems._0_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 2) = local_78.data._M_elems._8_8_;
    (local_38->m_backend).exp = local_78.exp;
    (local_38->m_backend).neg = local_78.neg;
    (local_38->m_backend).fpclass = local_78.fpclass;
    (local_38->m_backend).prec_elem = local_78.prec_elem;
    __return_storage_ptr__ = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::nonbasicValue()
   {
      int i;
      StableSum<R> val;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

#ifndef ENABLE_ADDITIONAL_CHECKS

      // if the value is available we don't need to recompute it
      if(m_nonbasicValueUpToDate)
         return m_nonbasicValue;

#endif

      if(rep() == COLUMN)
      {
         if(type() == LEAVE)
         {
            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theUCbound[i] * SPxLPBase<R>::upper(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::upper(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theLCbound[i] * SPxLPBase<R>::lower(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));
                  val += this->maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theLRbound[i] * SPxLPBase<R>::rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theURbound[i] * SPxLPBase<R>::lhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lhs(i), SPxLPBase<R>::rhs(i), this->epsilon()));
                  val += this->maxRowObj(i) * SPxLPBase<R>::lhs(i);
                  break;

               default:
                  break;
               }
            }
         }
         else
         {
            assert(type() == ENTER);

            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxObj(i) * theUCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLCbound[i], theUCbound[i], this->epsilon()));
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxRowObj(i) * theLRbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLRbound[i], theURbound[i], this->epsilon()));
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               default:
                  break;
               }
            }
         }
      }
      else
      {
         assert(rep() == ROW);
         assert(type() == ENTER);

         for(i = this->nCols() - 1; i >= 0; --i)
         {
            switch(ds.colStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theUCbound[i] * this->lower(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLCbound[i] * this->upper(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLCbound[i] * this->upper(i);
               val += theUCbound[i] * this->lower(i);
               break;

            default:
               break;
            }
         }

         for(i = this->nRows() - 1; i >= 0; --i)
         {
            switch(ds.rowStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theURbound[i] * this->lhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLRbound[i] * this->rhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLRbound[i] * this->rhs(i);
               val += theURbound[i] * this->lhs(i);
               break;

            default:
               break;
            }
         }
      }

#ifdef ENABLE_ADDITIONAL_CHECKS

      if(m_nonbasicValueUpToDate && NE(m_nonbasicValue, val))
      {
         SPX_MSG_ERROR(std::cerr << "stored nonbasic value: " << m_nonbasicValue
                       << ", correct nonbasic value: " << val
                       << ", violation: " << val - m_nonbasicValue << std::endl;)
         assert(EQrel(m_nonbasicValue, val, 1e-12));
      }

#endif

      if(!m_nonbasicValueUpToDate)
      {
         m_nonbasicValue = R(val);
         m_nonbasicValueUpToDate = true;
      }

      return val;
   }